

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGParameters.h
# Opt level: O0

bool __thiscall
dg::DGParameters<dg::LLVMNode>::add
          (DGParameters<dg::LLVMNode> *this,KeyT k,LLVMNode *val_in,LLVMNode *val_out,
          ContainerType *C)

{
  LLVMNode *in_RCX;
  LLVMNode *in_RDX;
  BBlock<dg::LLVMNode> *in_RDI;
  bool bVar1;
  __enable_if_t<is_constructible<value_type,_pair<Value_*,_DGParameterPair<LLVMNode>_>_&>::value,_pair<iterator,_bool>_>
  _Var2;
  pair<llvm::Value_*,_dg::DGParameterPair<dg::LLVMNode>_> v;
  LLVMNode *in_stack_ffffffffffffff68;
  pair<llvm::Value_*,_dg::DGParameterPair<dg::LLVMNode>_> *__x;
  map<llvm::Value_*,_dg::DGParameterPair<dg::LLVMNode>,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::DGParameterPair<dg::LLVMNode>_>_>_>
  *this_00;
  undefined1 local_58 [88];
  
  __x = (pair<llvm::Value_*,_dg::DGParameterPair<dg::LLVMNode>_> *)local_58;
  DGParameterPair<dg::LLVMNode>::DGParameterPair((DGParameterPair<dg::LLVMNode> *)__x,in_RDX,in_RCX)
  ;
  this_00 = (map<llvm::Value_*,_dg::DGParameterPair<dg::LLVMNode>,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::DGParameterPair<dg::LLVMNode>_>_>_>
             *)(local_58 + 0x10);
  std::make_pair<llvm::Value*&,dg::DGParameterPair<dg::LLVMNode>>
            (&in_RDI->key,(DGParameterPair<dg::LLVMNode> *)in_stack_ffffffffffffff68);
  _Var2 = std::
          map<llvm::Value*,dg::DGParameterPair<dg::LLVMNode>,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::DGParameterPair<dg::LLVMNode>>>>
          ::insert<std::pair<llvm::Value*,dg::DGParameterPair<dg::LLVMNode>>&>(this_00,__x);
  bVar1 = ((_Var2.second ^ 0xffU) & 1) == 0;
  if (bVar1) {
    BBlock<dg::LLVMNode>::append(in_RDI,in_stack_ffffffffffffff68);
    BBlock<dg::LLVMNode>::append(in_RDI,in_stack_ffffffffffffff68);
  }
  return bVar1;
}

Assistant:

bool add(KeyT k, NodeT *val_in, NodeT *val_out, ContainerType *C) {
        auto v = std::make_pair(k, DGParameterPair<NodeT>(val_in, val_out));
        if (!C->insert(v).second)
            // we already has param with this key
            return false;

        BBIn->append(val_in);
        BBOut->append(val_out);

        return true;
    }